

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O0

bool json::
     save_container<__gnu_cxx::__normal_iterator<obj_array_var1*,std::vector<obj_array_var1,std::allocator<obj_array_var1>>>>
               (ostream *out,
               __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
               begin,__normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
                     end,int tabs)

{
  bool bVar1;
  byte bVar2;
  reference t;
  __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
  local_30;
  __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
  i;
  int tabs_local;
  ostream *out_local;
  __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
  end_local;
  __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
  begin_local;
  
  i._M_current._4_4_ = tabs;
  out_local = (ostream *)end._M_current;
  end_local = begin;
  std::operator<<(out,'[');
  local_30._M_current = end_local._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&local_30,
                            (__normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
                             *)&out_local), bVar1) {
    bVar1 = __gnu_cxx::operator!=(&local_30,&end_local);
    if (bVar1) {
      std::operator<<(out,',');
    }
    t = __gnu_cxx::
        __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
        ::operator*(&local_30);
    save<obj_array_var1>(out,t,i._M_current._4_4_ + 1);
    __gnu_cxx::
    __normal_iterator<obj_array_var1_*,_std::vector<obj_array_var1,_std::allocator<obj_array_var1>_>_>
    ::operator++(&local_30);
  }
  std::operator<<(out,']');
  bVar2 = std::ios::fail();
  return (bool)(bVar2 & 1);
}

Assistant:

bool save_container(std::ostream& out, iterator begin, iterator end, int tabs) {
	out << '[';
	for (iterator i = begin; i != end; ++i) {
		if (i != begin)
			out << ',';
		save(out, *i, tabs + 1);
	}
	out << ']';
	return out.fail();
}